

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_client_hello_get_extension
               (SSL_CLIENT_HELLO *client_hello,CBS *out,uint16_t extension_type)

{
  bool bVar1;
  int iVar2;
  byte unaff_BPL;
  uint16_t type;
  CBS extension;
  CBS extensions;
  uint16_t local_52;
  CBS local_50;
  CBS local_40;
  
  local_40.data = client_hello->extensions;
  local_40.len = client_hello->extensions_len;
  do {
    if (local_40.len == 0) {
      unaff_BPL = 0;
      break;
    }
    iVar2 = CBS_get_u16(&local_40,&local_52);
    if ((iVar2 == 0) || (iVar2 = CBS_get_u16_length_prefixed(&local_40,&local_50), iVar2 == 0)) {
      unaff_BPL = 0;
LAB_002436a6:
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (local_52 == extension_type) {
        out->data = local_50.data;
        out->len = local_50.len;
        unaff_BPL = 1;
        goto LAB_002436a6;
      }
    }
  } while (bVar1);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ssl_client_hello_get_extension(const SSL_CLIENT_HELLO *client_hello,
                                    CBS *out, uint16_t extension_type) {
  CBS extensions;
  CBS_init(&extensions, client_hello->extensions, client_hello->extensions_len);
  while (CBS_len(&extensions) != 0) {
    // Decode the next extension.
    uint16_t type;
    CBS extension;
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      return false;
    }

    if (type == extension_type) {
      *out = extension;
      return true;
    }
  }

  return false;
}